

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

errr Term_set_cursor(_Bool v)

{
  if (Term->scr->cv == v) {
    return 1;
  }
  Term->scr->cv = v;
  return 0;
}

Assistant:

errr Term_set_cursor(bool v)
{
	/* Already done */
	if (Term->scr->cv == v) return (1);

	/* Change */
	Term->scr->cv = v;

	/* Success */
	return (0);
}